

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

int uv__iou_fs_fsync_or_fdatasync(uv_loop_t *loop,uv_fs_t *req,uint32_t fsync_flags)

{
  uv__iou *iou_00;
  uv__io_uring_sqe *puVar1;
  uv__iou *iou;
  uv__io_uring_sqe *sqe;
  uint32_t fsync_flags_local;
  uv_fs_t *req_local;
  uv_loop_t *loop_local;
  
  iou_00 = (uv__iou *)((long)loop->internal_fields + 0x150);
  puVar1 = uv__iou_get_sqe(iou_00,loop,req);
  if (puVar1 != (uv__io_uring_sqe *)0x0) {
    puVar1->fd = req->file;
    (puVar1->field_7).rw_flags = fsync_flags;
    puVar1->opcode = '\x03';
    uv__iou_submit(iou_00);
  }
  loop_local._4_4_ = (uint)(puVar1 != (uv__io_uring_sqe *)0x0);
  return loop_local._4_4_;
}

Assistant:

int uv__iou_fs_fsync_or_fdatasync(uv_loop_t* loop,
                                  uv_fs_t* req,
                                  uint32_t fsync_flags) {
  struct uv__io_uring_sqe* sqe;
  struct uv__iou* iou;

  iou = &uv__get_internal_fields(loop)->iou;

  sqe = uv__iou_get_sqe(iou, loop, req);
  if (sqe == NULL)
    return 0;

  /* Little known fact: setting seq->off and seq->len turns
   * it into an asynchronous sync_file_range() operation.
   */
  sqe->fd = req->file;
  sqe->fsync_flags = fsync_flags;
  sqe->opcode = UV__IORING_OP_FSYNC;

  uv__iou_submit(iou);

  return 1;
}